

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O3

void idx2::DecompressBufZstd(buffer *Input,buffer *Output)

{
  int iVar1;
  long lVar2;
  buffer *dstCapacity;
  buffer *pbVar3;
  unsigned_long_long dstCapacity_00;
  size_t sVar4;
  int iVar5;
  long lVar6;
  buffer *Src;
  byte *dst;
  i64 unaff_R13;
  buffer bStack_60;
  buffer *pbStack_40;
  
  dstCapacity = (buffer *)ZSTD_getFrameContentSize(Input->Data,Input->Bytes);
  dst = Output->Data;
  Src = dstCapacity;
  pbVar3 = (buffer *)ZSTD_decompress(dst,(size_t)dstCapacity,Input->Data,Input->Bytes);
  if (pbVar3 != dstCapacity) {
    DecompressBufZstd();
    pbStack_40 = Output;
    dstCapacity_00 = ZSTD_getFrameContentSize(*(void **)dst,*(size_t *)(dst + 8));
    lVar2 = Src->Bytes;
    lVar6 = lVar2;
    if ((long)(dstCapacity_00 + 8) < lVar2) goto LAB_0017cb71;
    do {
      unaff_R13 = (lVar6 * 3) / 2;
      lVar6 = unaff_R13 + 8;
    } while (unaff_R13 <= (long)dstCapacity_00);
    if (unaff_R13 + 8 <= lVar2) goto LAB_0017cb71;
    unaff_R13 = unaff_R13 + 0x10;
    if (Mallocator()::Instance == '\0') goto LAB_0017cb9b;
    while( true ) {
      bStack_60.Data = (byte *)0x0;
      bStack_60.Bytes = 0;
      bStack_60.Alloc = (allocator *)&Mallocator()::Instance;
      AllocBuf(&bStack_60,unaff_R13,Src->Alloc);
      iVar1 = *(int *)&Src[1].Alloc + 7;
      iVar5 = *(int *)&Src[1].Alloc + 0xe;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      MemCopy(Src,&bStack_60,(u64)(Src[1].Data + ((long)(iVar5 >> 3) - (long)Src->Data)));
      Src[1].Data = bStack_60.Data + ((long)Src[1].Data - (long)Src->Data);
      DeallocBuf(Src);
      Src->Alloc = bStack_60.Alloc;
      Src->Data = bStack_60.Data;
      Src->Bytes = bStack_60.Bytes;
LAB_0017cb71:
      sVar4 = ZSTD_decompress(Src->Data,dstCapacity_00,*(void **)dst,*(size_t *)(dst + 8));
      if (sVar4 == dstCapacity_00) break;
      DecompressBufZstd();
LAB_0017cb9b:
      DecompressBufZstd();
    }
    return;
  }
  return;
}

Assistant:

void
DecompressBufZstd(const buffer& Input, buffer* Output)
{
  unsigned long long const OutputSize = ZSTD_getFrameContentSize(Input.Data, Size(Input));
  idx2_Assert(Size(*Output) >= (i64)OutputSize);
  size_t const Result = ZSTD_decompress(Output->Data, OutputSize, Input.Data, Size(Input));
  if (Result != OutputSize)
  {
    fprintf(stderr, "Zstd decompression failed\n");
    exit(1);
  }
}